

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
argument_loader<std::vector<long,std::allocator<long>>&,pybind11::slice,std::vector<long,std::allocator<long>>const&>
::load_impl_sequence<0ul,1ul,2ul>(void *param_1,long param_2)

{
  reference pvVar1;
  initializer_list<bool> *this;
  const_iterator pbVar2;
  const_iterator pbVar3;
  bool r;
  const_iterator __end0;
  const_iterator __begin0;
  handle in_stack_00000038;
  initializer_list<bool> *__range3;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  handle in_stack_ffffffffffffff78;
  reference local_80;
  PyObject *local_70;
  reference local_68;
  PyObject *local_58;
  reference local_50;
  PyObject *local_40;
  bool local_33;
  undefined1 local_32;
  undefined1 local_31;
  initializer_list<bool> local_30;
  initializer_list<bool> *local_20;
  long local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  std::
  get<0ul,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>,pybind11::detail::type_caster<pybind11::slice,void>,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>>
            ((tuple<pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>,_pybind11::detail::type_caster<pybind11::slice,_void>,_pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>_>
              *)0x2d1459);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      0);
  local_40 = pvVar1->m_ptr;
  local_50 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff70,
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator_cast_to_bool(&local_50);
  local_33 = list_caster<std::vector<long,_std::allocator<long>_>,_long>::load
                       ((list_caster<std::vector<long,_std::allocator<long>_>,_long> *)__begin0,
                        in_stack_00000038,__end0._7_1_);
  this = (initializer_list<bool> *)
         std::
         get<1ul,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>,pybind11::detail::type_caster<pybind11::slice,void>,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>>
                   ((tuple<pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>,_pybind11::detail::type_caster<pybind11::slice,_void>,_pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>_>
                     *)0x2d14ca);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      1);
  local_58 = pvVar1->m_ptr;
  local_68 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff70,
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator_cast_to_bool(&local_68);
  local_32 = pyobject_caster<pybind11::slice>::load<pybind11::slice,_0>
                       ((pyobject_caster<pybind11::slice> *)in_stack_ffffffffffffff70,
                        in_stack_ffffffffffffff78,(bool)in_stack_ffffffffffffff6f);
  std::
  get<2ul,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>,pybind11::detail::type_caster<pybind11::slice,void>,pybind11::detail::type_caster<std::vector<long,std::allocator<long>>,void>>
            ((tuple<pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>,_pybind11::detail::type_caster<pybind11::slice,_void>,_pybind11::detail::type_caster<std::vector<long,_std::allocator<long>_>,_void>_>
              *)0x2d153f);
  pvVar1 = std::vector<pybind11::handle,_std::allocator<pybind11::handle>_>::operator[]
                     ((vector<pybind11::handle,_std::allocator<pybind11::handle>_> *)(local_18 + 8),
                      2);
  local_70 = pvVar1->m_ptr;
  local_80 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff70,
                        CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::_Bit_reference::operator_cast_to_bool(&local_80);
  local_31 = list_caster<std::vector<long,_std::allocator<long>_>,_long>::load
                       ((list_caster<std::vector<long,_std::allocator<long>_>,_long> *)__begin0,
                        in_stack_00000038,__end0._7_1_);
  local_30._M_array = &local_33;
  local_30._M_len = 3;
  local_20 = &local_30;
  pbVar2 = std::initializer_list<bool>::begin(local_20);
  pbVar3 = std::initializer_list<bool>::end(this);
  while( true ) {
    if (pbVar2 == pbVar3) {
      return true;
    }
    if ((*pbVar2 & 1U) == 0) break;
    pbVar2 = pbVar2 + 1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }